

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

wchar_t canNodump(void)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t flags;
  uint local_1c;
  
  wVar3 = L'\0';
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                      ,L'ઘ',"cannodumptest",L'Ƥ',L'\0',(void *)0x0);
  iVar1 = open("cannodumptest",0x800);
  if (-1 < iVar1) {
    wVar3 = L'\0';
    iVar2 = ioctl(iVar1,0x80086601,&local_1c);
    if (-1 < iVar2) {
      local_1c = local_1c | 0x40;
      wVar3 = L'\0';
      iVar2 = ioctl(iVar1,0x40086602);
      if (-1 < iVar2) {
        close(iVar1);
        wVar3 = L'\0';
        iVar1 = open("cannodumptest",0x800);
        if (-1 < iVar1) {
          wVar3 = L'\0';
          iVar2 = ioctl(iVar1,0x80086601,&local_1c);
          if (-1 < iVar2) {
            close(iVar1);
            wVar3 = local_1c >> 6 & 1;
          }
        }
      }
    }
  }
  return wVar3;
}

Assistant:

int
canNodump(void)
{
#if defined(HAVE_STRUCT_STAT_ST_FLAGS) && defined(UF_NODUMP)
	const char *path = "cannodumptest";
	struct stat sb;

	assertion_make_file(__FILE__, __LINE__, path, 0644, 0, NULL);
	if (chflags(path, UF_NODUMP) < 0)
		return (0);
	if (stat(path, &sb) < 0)
		return (0);
	if (sb.st_flags & UF_NODUMP)
		return (1);
#elif (defined(FS_IOC_GETFLAGS) && defined(HAVE_WORKING_FS_IOC_GETFLAGS) \
	 && defined(FS_NODUMP_FL)) || \
      (defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS) \
	 && defined(EXT2_NODUMP_FL))
	const char *path = "cannodumptest";
	int fd, r, flags;

	assertion_make_file(__FILE__, __LINE__, path, 0644, 0, NULL);
	fd = open(path, O_RDONLY | O_NONBLOCK);
	if (fd < 0)
		return (0);
	r = ioctl(fd,
#ifdef FS_IOC_GETFLAGS
	    FS_IOC_GETFLAGS,
#else
	    EXT2_IOC_GETFLAGS,
#endif
	    &flags);
	if (r < 0)
		return (0);
#ifdef FS_NODUMP_FL
	flags |= FS_NODUMP_FL;
#else
	flags |= EXT2_NODUMP_FL;
#endif
	r = ioctl(fd,
#ifdef FS_IOC_SETFLAGS
	    FS_IOC_SETFLAGS,
#else
	    EXT2_IOC_SETFLAGS,
#endif
	   &flags);
	if (r < 0)
		return (0);
	close(fd);
	fd = open(path, O_RDONLY | O_NONBLOCK);
	if (fd < 0)
		return (0);
	r = ioctl(fd,
#ifdef FS_IOC_GETFLAGS
	    FS_IOC_GETFLAGS,
#else
	    EXT2_IOC_GETFLAGS,
#endif
	    &flags);
	if (r < 0)
		return (0);
	close(fd);
#ifdef FS_NODUMP_FL
	if (flags & FS_NODUMP_FL)
#else
	if (flags & EXT2_NODUMP_FL)
#endif
		return (1);
#endif
	return (0);
}